

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O1

void __thiscall
Js::LineOffsetCache::AddLine
          (LineOffsetCache *this,Recycler *allocator,charcount_t characterOffset,
          charcount_t byteOffset)

{
  Type *pTVar1;
  int iVar2;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *list;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar3;
  code *pcVar4;
  undefined8 address;
  bool bVar5;
  Recycler *alloc;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  undefined4 *puVar6;
  uint *puVar7;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  list = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
         (this->lineCharacterOffsetCacheList).ptr;
  this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
            (this->lineByteOffsetCacheList).ptr;
  data._32_8_ = &this->lineByteOffsetCacheList;
  if (this_00 ==
      (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0 &&
      characterOffset != byteOffset) {
    local_68 = (undefined1  [8])
               &JsUtil::
                List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2c39f0e;
    data.filename._0_4_ = 0xdf;
    alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
    this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
              new<Memory::Recycler>(0x30,alloc,0x38bbb2);
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
         (uint *)0x0;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count = 0;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).alloc = allocator
    ;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f08d0;
    this_00->length = 0;
    this_00->increment = 4;
    JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
    Copy<JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
              ((List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer> *)
               this_00,list);
    address = data._32_8_;
    Memory::Recycler::WBSetBit((char *)data._32_8_);
    *(List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> **)address =
         this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)address);
  }
  if (this_00 !=
      (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0) {
    JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray(this_00,0);
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr
    [(this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count] =
         byteOffset;
    pTVar1 = &(this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count;
    *pTVar1 = *pTVar1 + 1;
  }
  JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(list,0);
  (list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr
  [(list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count] =
       characterOffset;
  pTVar1 = &(list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count;
  *pTVar1 = *pTVar1 + 1;
  if ((*(long *)data._32_8_ != 0) &&
     (*(int *)(*(long *)data._32_8_ + 0x10) != ((this->lineCharacterOffsetCacheList).ptr)->count)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xea,
                                "(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count())"
                                ,
                                "this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count()"
                               );
    if (!bVar5) goto LAB_0078d3ec;
    *puVar6 = 0;
  }
  pRVar3 = (this->lineCharacterOffsetCacheList).ptr;
  iVar2 = pRVar3->count;
  if (1 < iVar2) {
    puVar7 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                       (pRVar3,iVar2 + -2);
    if (characterOffset <= *puVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                  ,0xef,"(characterOffset > previousCharacterOffset)",
                                  "The character offsets must be inserted in increasing order per line."
                                 );
      if (!bVar5) goto LAB_0078d3ec;
      *puVar6 = 0;
    }
    pRVar3 = *(ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> **)data._32_8_;
    if (pRVar3 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
      puVar7 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                         (pRVar3,pRVar3->count + -2);
      if (byteOffset <= *puVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                    ,0xf3,"(byteOffset > previousByteOffset)",
                                    "The byte offsets must be inserted in increasing order per line."
                                   );
        if (!bVar5) {
LAB_0078d3ec:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
    }
  }
  return;
}

Assistant:

void LineOffsetCache::AddLine(Recycler * allocator, charcount_t characterOffset, charcount_t byteOffset)
    {
        LineOffsetCacheList * characterOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineCharacterOffsetCacheList;
        LineOffsetCacheList * byteOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineByteOffsetCacheList;
        if (characterOffset != byteOffset && byteOffsetList == nullptr)
        {
                byteOffsetList = RecyclerNew(allocator, LineOffsetCacheList, allocator);
                byteOffsetList->Copy(characterOffsetList);
                this->lineByteOffsetCacheList = byteOffsetList;
        }
        if (byteOffsetList != nullptr)
        {
            byteOffsetList->Add(byteOffset);
        }
        characterOffsetList->Add(characterOffset);

#if DBG
        Assert(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count());
        if (this->lineCharacterOffsetCacheList->Count() > 1)
        {
            // Ensure that the list remains sorted during insertion.
            charcount_t previousCharacterOffset = this->lineCharacterOffsetCacheList->Item(this->lineCharacterOffsetCacheList->Count() - 2);
            AssertMsg(characterOffset > previousCharacterOffset, "The character offsets must be inserted in increasing order per line.");
            if (this->lineByteOffsetCacheList != nullptr)
            {
                charcount_t previousByteOffset = this->lineByteOffsetCacheList->Item(this->lineByteOffsetCacheList->Count() - 2);
                AssertMsg(byteOffset > previousByteOffset, "The byte offsets must be inserted in increasing order per line.");
            }
        }
#endif // DBG
    }